

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O0

string * __thiscall
BayesianGameForDecPOMDPStage::SoftPrint_abi_cxx11_(BayesianGameForDecPOMDPStage *this)

{
  bool bVar1;
  Index IVar2;
  ostream *poVar3;
  type pPVar4;
  BayesianGameForDecPOMDPStageInterface *in_RSI;
  string *in_RDI;
  stringstream ss;
  BayesianGameForDecPOMDPStageInterface *in_stack_fffffffffffffd98;
  shared_ptr<const_PartialJointPolicyDiscretePure> *in_stack_fffffffffffffda0;
  string local_208 [32];
  shared_ptr<const_PartialJointPolicyDiscretePure> local_1e8;
  string local_1d8 [64];
  stringstream local_198 [16];
  ostream local_188 [288];
  BayesianGameIdenticalPayoff *in_stack_ffffffffffffff98;
  
  std::__cxx11::stringstream::stringstream(local_198);
  poVar3 = std::operator<<(local_188,"Bayesian Game for stage t=");
  IVar2 = BayesianGameForDecPOMDPStageInterface::GetStage(in_RSI);
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,IVar2);
  poVar3 = std::operator<<(poVar3," of a Dec-POMDP");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  BayesianGameForDecPOMDPStageInterface::GetPastJointPolicy(in_stack_fffffffffffffd98);
  bVar1 = boost::operator!=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  boost::shared_ptr<const_PartialJointPolicyDiscretePure>::~shared_ptr
            ((shared_ptr<const_PartialJointPolicyDiscretePure> *)0x8b776f);
  if (bVar1) {
    poVar3 = std::operator<<(local_188,"Past policy that lead to this BG=");
    BayesianGameForDecPOMDPStageInterface::GetPastJointPolicy(in_stack_fffffffffffffd98);
    pPVar4 = boost::shared_ptr<const_PartialJointPolicyDiscretePure>::operator->(&local_1e8);
    (*(pPVar4->super_JointPolicyDiscretePure).super_JointPolicyDiscrete.super_JointPolicy.
      _vptr_JointPolicy[6])(local_1d8);
    poVar3 = std::operator<<(poVar3,local_1d8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1d8);
    boost::shared_ptr<const_PartialJointPolicyDiscretePure>::~shared_ptr
              ((shared_ptr<const_PartialJointPolicyDiscretePure> *)0x8b781d);
  }
  poVar3 = local_188;
  BayesianGameIdenticalPayoff::SoftPrint_abi_cxx11_(in_stack_ffffffffffffff98);
  std::operator<<(poVar3,local_208);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string BayesianGameForDecPOMDPStage::SoftPrint() const
{
    stringstream ss;
    ss << "Bayesian Game for stage t="<<GetStage()<<" of a Dec-POMDP"<<endl;
    if(GetPastJointPolicy() != 0)
        ss<< "Past policy that lead to this BG=" << GetPastJointPolicy()->SoftPrint()<<endl;
    ss << BayesianGameIdenticalPayoff::SoftPrint();    
    return(ss.str());
}